

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall helics::BrokerBase::generateBaseCLI(BrokerBase *this)

{
  initializer_list<const_char_*> values;
  element_type *this_00;
  OptionDefaults *pOVar1;
  Option *pOVar2;
  App *variable;
  string *flag_name;
  Option *val;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  Option_group *timeout_group;
  Option *popt;
  HelicsConfigJSON *fmtr;
  shared_ptr<helics::helicsCLI11App> *hApp;
  Validator *in_stack_ffffffffffffee08;
  Option *in_stack_ffffffffffffee10;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffee18;
  allocator<char> *__val;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffee20;
  Option *in_stack_ffffffffffffee30;
  char (*in_stack_ffffffffffffee38) [44];
  allocator<char> *in_stack_ffffffffffffee40;
  allocator<char> *__a;
  char *in_stack_ffffffffffffee48;
  App *pAVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_ffffffffffffee60;
  Validator *in_stack_ffffffffffffee68;
  Option *in_stack_ffffffffffffee70;
  Option *in_stack_ffffffffffffee78;
  Option *in_stack_ffffffffffffee80;
  string *in_stack_ffffffffffffeed0;
  string *in_stack_ffffffffffffeed8;
  App *in_stack_ffffffffffffeee0;
  string *in_stack_ffffffffffffeee8;
  App *in_stack_ffffffffffffeef0;
  string *in_stack_ffffffffffffef18;
  string *option_description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef20;
  string *in_stack_ffffffffffffef28;
  string *option_name;
  App *in_stack_ffffffffffffef30;
  App *this_02;
  string *in_stack_ffffffffffffef38;
  App *in_stack_ffffffffffffef40;
  App *in_stack_fffffffffffff000;
  allocator<char> local_cf1 [40];
  allocator<char> local_cc9 [40];
  allocator<char> local_ca1 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c79;
  allocator<char> local_c51 [40];
  allocator<char> local_c29 [40];
  allocator<char> local_c01 [40];
  allocator<char> local_bd9 [40];
  allocator<char> local_bb1 [40];
  allocator<char> local_b89 [40];
  allocator<char> local_b61 [40];
  allocator<char> local_b39 [40];
  undefined1 local_b11 [80];
  string local_ac1;
  string local_a99;
  allocator<char> local_a71 [40];
  allocator<char> local_a49 [33];
  App *local_a28;
  allocator<char> local_a19 [40];
  allocator<char> local_9f1 [40];
  allocator<char> local_9c9 [40];
  allocator<char> local_9a1 [40];
  allocator<char> local_979 [40];
  allocator<char> local_951 [40];
  allocator<char> local_929 [80];
  allocator<char> local_8d9 [40];
  allocator<char> local_8b1 [40];
  allocator<char> local_889 [80];
  allocator<char> local_839 [33];
  Option *local_818;
  allocator<char> local_809 [40];
  allocator<char> local_7e1 [40];
  allocator<char> local_7b9 [40];
  allocator<char> local_791 [40];
  allocator<char> local_769 [40];
  allocator<char> local_741 [40];
  allocator<char> local_719 [40];
  allocator<char> local_6f1 [40];
  allocator<char> local_6c9 [33];
  char *local_6a8;
  char *pcStack_6a0;
  char *local_698;
  char *pcStack_690;
  char **local_688;
  undefined8 local_680;
  shared_ptr<helics::helicsCLI11App> *in_stack_fffffffffffffa50;
  LogManager *in_stack_fffffffffffffa58;
  allocator<char> local_551 [40];
  allocator<char> local_529 [40];
  allocator<char> local_501 [40];
  allocator<char> local_4d9 [40];
  allocator<char> local_4b1 [40];
  allocator<char> local_489 [40];
  allocator<char> local_461 [40];
  allocator<char> local_439 [40];
  allocator<char> local_411 [40];
  allocator<char> local_3e9 [40];
  allocator<char> local_3c1 [40];
  allocator<char> local_399 [40];
  allocator<char> local_371 [40];
  allocator<char> local_349 [40];
  allocator<char> local_321 [40];
  allocator<char> local_2f9 [40];
  allocator<char> local_2d1 [40];
  allocator<char> local_2a9 [40];
  allocator<char> local_281 [40];
  allocator<char> local_259 [40];
  allocator<char> local_231 [40];
  allocator<char> local_209 [40];
  allocator<char> local_1e1 [40];
  allocator<char> local_1b9 [40];
  allocator<char> local_191 [40];
  allocator<char> local_169 [40];
  allocator<char> local_141 [40];
  allocator<char> local_119 [40];
  allocator<char> local_f1 [40];
  allocator<char> local_c9 [40];
  allocator<char> local_a1 [40];
  allocator<char> local_79 [40];
  allocator<char> local_51 [49];
  HelicsConfigJSON *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<helics::helicsCLI11App,char_const(&)[44]>(in_stack_ffffffffffffee38);
  CLI::std::__shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
  local_20 = addJsonConfig(in_stack_fffffffffffff000);
  CLI::ConfigBase::maxLayers(&local_20->super_ConfigBase,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  HelicsConfigJSON::promoteSection
            ((HelicsConfigJSON *)in_stack_ffffffffffffee10,(string *)in_stack_ffffffffffffee08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_51);
  this_00 = CLI::std::
            __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x46d6ef);
  pOVar1 = CLI::App::option_defaults(&this_00->super_App);
  pOVar1 = CLI::OptionDefaults::ignore_underscore(pOVar1,true);
  CLI::OptionDefaults::ignore_case(pOVar1,true);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46d73e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20,
             in_stack_ffffffffffffef18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_a1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_79);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46d828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20,
             in_stack_ffffffffffffef18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_f1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_c9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46d912);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,
             in_stack_ffffffffffffef18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_141);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_119);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46d9fc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20,
             in_stack_ffffffffffffef18);
  CLI::Option::capture_default_str(in_stack_ffffffffffffee30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_191);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_169);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46dafd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20,
             in_stack_ffffffffffffef18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_1e1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_1b9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46dbe7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20,
             in_stack_ffffffffffffef18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_231);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_209);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46dcd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,(int *)in_stack_ffffffffffffef20,
             in_stack_ffffffffffffef18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_281);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_259);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46ddbb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,
             in_stack_ffffffffffffef18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::Option::envname(in_stack_ffffffffffffee10,(string *)in_stack_ffffffffffffee08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_2f9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_2d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_2a9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46df13);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_349);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_321);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46dfff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_399);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_371);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e0eb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_3e9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_3c1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e1d7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_439);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_411);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e2c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_489);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_461);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e3af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_4d9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_4b1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e49b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_529);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_501);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e587);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::BrokerBase::generateBaseCLI()::__0,void>
            (in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_option_function<std::__cxx11::string>
            (in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  local_698 = "distributed";
  pcStack_690 = "default";
  local_6a8 = "async";
  pcStack_6a0 = "global";
  local_688 = &local_6a8;
  local_680 = 4;
  values._M_len = (size_type)in_stack_ffffffffffffee70;
  values._M_array = (iterator)in_stack_ffffffffffffee68;
  CLI::IsMember::IsMember<char_const*>((IsMember *)in_stack_ffffffffffffee60,values);
  CLI::Validator::Validator((Validator *)in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::Option::check(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,in_stack_ffffffffffffee60);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_6c9);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffee10);
  CLI::IsMember::~IsMember((IsMember *)0x46e73d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa5f);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x46e764);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_551);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e78b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_719);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_6f1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e877);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_769);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_741);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46e963);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_7b9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_791);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46ea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_809);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_7e1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46eb3b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::BrokerBase::generateBaseCLI()::__1,void>
            (in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  pOVar2 = CLI::App::add_option_function<std::__cxx11::string>
                     (in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  CLI::Option::expected(pOVar2,0,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  pOVar2 = CLI::Option::default_str(in_stack_ffffffffffffee10,(string *)in_stack_ffffffffffffee08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_8b1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_889);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x46ecae);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_839);
  local_818 = pOVar2;
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46ece5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::BrokerBase::generateBaseCLI()::__2,void>
            (in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_option_function<std::__cxx11::string>
            (in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  CLI::Option::excludes(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_929);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x46ede5);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_8d9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46ee0c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_979);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_951);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46eef8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_9c9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_9a1);
  CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x46efeb);
  LogManager::addLoggingCLI(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46f00a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_a19);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_9f1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46f0f6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  variable = &CLI::App::add_option_group<CLI::Option_group>
                        (in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                         in_stack_ffffffffffffeed0)->super_App;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_a71);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_a49);
  option_name = &local_a99;
  this_02 = variable;
  local_a28 = variable;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  option_description = &local_ac1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (this_02,option_name,(TimeRepresentation<count_time<9,_long>_> *)variable,
             option_description);
  CLI::Option::capture_default_str(in_stack_ffffffffffffee30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  flag_name = (string *)(in_RSI + 0xdc);
  pAVar4 = (App *)local_b11;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,flag_name,(bool *)in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator((allocator<char> *)local_b11);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator((allocator<char> *)(local_b11 + 0x28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (this_02,option_name,(TimeRepresentation<count_time<9,_long>_> *)variable,
             option_description);
  CLI::Option::capture_default_str(in_stack_ffffffffffffee30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_b61);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_b39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (this_02,option_name,(TimeRepresentation<count_time<9,_long>_> *)variable,
             option_description);
  CLI::Option::capture_default_str(in_stack_ffffffffffffee30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_bb1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_b89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (this_02,option_name,(TimeRepresentation<count_time<9,_long>_> *)variable,
             option_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_c01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_bd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (this_02,option_name,(TimeRepresentation<count_time<9,_long>_> *)variable,
             option_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_c51);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator(local_c29);
  this_01 = &local_c79;
  pAVar4 = local_a28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)pAVar4,in_stack_ffffffffffffee40);
  __a = local_ca1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pAVar4,__a);
  pOVar2 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (this_02,option_name,(TimeRepresentation<count_time<9,_long>_> *)variable,
                      option_description);
  CLI::Option::multi_option_policy(pOVar2,TakeLast);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator((allocator<char> *)local_ca1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  std::allocator<char>::~allocator((allocator<char> *)&local_c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pAVar4,__a);
  pOVar2 = (Option *)(in_RSI + 0x50);
  __val = local_cf1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pAVar4,__a);
  val = CLI::App::
        add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                  (this_02,option_name,(TimeRepresentation<count_time<9,_long>_> *)variable,
                   option_description);
  TimeRepresentation::operator_cast_to_double((TimeRepresentation<count_time<9,_long>_> *)0x46f8e1);
  std::__cxx11::to_string((double)__val);
  CLI::Option::default_str(pOVar2,(string *)val);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar2);
  std::allocator<char>::~allocator(local_cf1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar2);
  std::allocator<char>::~allocator(local_cc9);
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> BrokerBase::generateBaseCLI()
{
    auto hApp = std::make_shared<helicsCLI11App>("Arguments applying to all Brokers and Cores");
    auto* fmtr = addJsonConfig(hApp.get());
    fmtr->maxLayers(0);
    fmtr->promoteSection("helics");
    hApp->option_defaults()->ignore_underscore()->ignore_case();
    hApp->add_option("--federates,-f",
                     minFederateCount,
                     "the minimum number of federates that will be connecting");
    hApp->add_option("--maxfederates",
                     maxFederateCount,
                     "the maximum number of federates that will be connecting");
    hApp->add_option("--name,-n,--identifier,--uuid", identifier, "the name of the broker/core");
    hApp->add_option("--max_iterations",
                     maxIterationCount,
                     "the maximum number of iterations allowed")
        ->capture_default_str();
    hApp->add_option(
        "--minbrokers,--minbroker,--minbrokercount",
        minBrokerCount,
        "the minimum number of cores/brokers that need to be connected (ignored in cores)");
    hApp->add_option(
        "--children,--subbrokers",
        minChildCount,
        "the minimum number of child objects that need to be connected before entering init mode");
    hApp->add_option("--maxbrokers",
                     maxBrokerCount,
                     "the maximum number of brokers that will be connecting (ignored in cores)");
    hApp->add_option("--brokerkey",
                     brokerKey,
                     "specify a key to use for all connections to/from a broker")
        ->envname("HELICS_BROKER_KEY");
    hApp->add_flag(
        "--slowresponding",
        no_ping,
        "specify that a broker might be slow or unresponsive to ping requests from other brokers");
    hApp->add_flag(
        "--restrictive_time_policy",
        restrictive_time_policy,
        "specify that a broker should use a conservative time policy in the time coordinator");
    hApp->add_flag(
        "--debugging",
        debugging,
        "specify that a broker/core should operate in user debugging mode equivalent to --slow_responding --disable_timer");
    hApp->add_flag(
        "--allow_remote_control,!--disable_remote_control",
        allowRemoteControl,
        "enable the broker to respond to certain remote commands that affect operations, such as disconnect");
    hApp->add_flag(
        "--globaltime",
        globalTime,
        "specify that the broker should use a globalTime coordinator to coordinate a master clock time with all federates");
    hApp->add_flag("--global_disconnect",
                   globalDisconnect,
                   "specify that all federates should delay disconnection until all are done");
    hApp->add_flag(
        "--asynctime",
        asyncTime,
        "specify that the federation should use the asynchronous time coordinator (only minimal time management is handled in HELICS and federates are allowed to operate independently)");
    hApp->add_option_function<std::string>(
            "--timing",
            [this](const std::string& arg) {
                if (arg == "async") {
                    asyncTime = true;
                } else if (arg == "global") {
                    globalTime = true;
                } else {
                    asyncTime = false;
                    globalTime = false;
                }
            },
            "specify the timing method to use in the broker")
        ->check(CLI::IsMember({"async", "global", "distributed", "default"}));
    hApp->add_flag("--observer",
                   observer,
                   "specify that the broker/core should be added as an observer only");
    hApp->add_flag("--dynamic",
                   dynamicFederation,
                   "specify that the broker/core should allow dynamic federates");
    hApp->add_flag(
        "--disable_dynamic_sources",
        disableDynamicSources,
        "specify that the data sources must be registered before entering Initializing mode");
    hApp->add_flag("--json",
                   useJsonSerialization,
                   "use the JSON serialization mode for communications");

    // add the profiling setup command
    auto* popt =
        hApp->add_option_function<std::string>(
                "--profiler",
                [this](const std::string& fileName) {
                    if (!fileName.empty()) {
                        if (fileName == "log" || fileName == "true") {
                            if (prBuff) {
                                prBuff.reset();
                            }
                        } else {
                            if (!prBuff) {
                                prBuff = std::make_shared<ProfilerBuffer>();
                            }
                            prBuff->setOutputFile(fileName, false);
                        }

                        enable_profiling = true;
                    } else {
                        enable_profiling = false;
                    }
                },
                "activate profiling and set the profiler data output file, set to empty string to disable profiling, set to \"log\" to route profile message to the logging system.")
            ->expected(0, 1)
            ->default_str("log");

    // add the profiling append file option
    hApp->add_option_function<std::string>(
            "--profiler_append",
            [this](const std::string& fileName) {
                if (!fileName.empty()) {
                    if (!prBuff) {
                        prBuff = std::make_shared<ProfilerBuffer>();
                    }
                    prBuff->setOutputFile(fileName, true);

                    enable_profiling = true;
                } else {
                    enable_profiling = false;
                }
            },
            "activate profiling and set the profiler data output file; new profiler output will be appended to the file")
        ->excludes(popt);

    hApp->add_flag("--terminate_on_error",
                   terminate_on_error,
                   "specify that a broker should cause the federation to terminate on an error");
    hApp->add_flag(
        "--error_on_unmatched",
        errorOnUnmatchedConnections,
        "set the broker to terminate the cosimulation if there are unmatched connections");
    mLogManager->addLoggingCLI(hApp);

    hApp->add_flag(
        "--dumplog",
        dumplog,
        "capture a record of all messages and dump a complete log to file or console on termination");

    auto* timeout_group =
        hApp->add_option_group("timeouts", "Options related to network and process timeouts");
    timeout_group
        ->add_option(
            "--tick",
            tickTimer,
            "heartbeat time in ms, if there is no broker communication for 2 ticks then "
            "secondary actions are taken (can also be entered as a time like '10s' or '45ms')")
        ->capture_default_str();
    timeout_group->add_flag("--disable_timer,--no_tick",
                            disable_timer,
                            "if set to true all timeouts are disabled, cannot be re-enabled later");
    timeout_group
        ->add_option(
            "--timeout",
            timeout,
            "time to wait to establish a network or for a connection to communicate, default "
            "unit is in ms (can also be entered as "
            "a time like '10s' or '45ms') ")
        ->capture_default_str();
    timeout_group
        ->add_option(
            "--networktimeout",
            networkTimeout,
            "time to wait for a broker connection, default unit is in ms (can also be entered as a time "
            "like '10s' or '45ms') ")
        ->capture_default_str();
    timeout_group->add_option(
        "--querytimeout",
        queryTimeout,
        "time to wait for a query to be answered; default unit is in ms  and default time is 15s (can also be entered as a time "
        "like '10s' or '45ms') ");
    timeout_group->add_option(
        "--granttimeout",
        grantTimeout,
        "time to wait for a time request to be granted before triggering diagnostic actions; default is in ms (can also be entered as a time "
        "like '10s' or '45ms')");
    timeout_group
        ->add_option(
            "--maxcosimduration",
            maxCoSimDuration,
            "the maximum time a broker/core should be active, the co-simulation will self terminate if it is still active after this duration, the time resolution is the tick timer (can also be entered as a time "
            "like '10s' or '45ms')")
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast);
    timeout_group
        ->add_option("--errordelay,--errortimeout",
                     errorDelay,
                     "time to wait after an error state before terminating "
                     "like '10s' or '45ms') ")
        ->default_str(std::to_string(static_cast<double>(errorDelay)));

    return hApp;
}